

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_compare.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *a;
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  
  pcVar5 = *argv;
  uVar2 = 0;
  do {
    iVar1 = getopt(argc,argv,"pahv");
    if (iVar1 == 0x61) {
      uVar3 = 2;
    }
    else {
      uVar3 = 1;
      if (iVar1 != 0x70) break;
    }
    uVar2 = uVar2 | uVar3;
  } while( true );
  if (iVar1 == -1) {
    lVar4 = (long)_optind;
    if (argc - _optind == 3) {
      uVar2 = version_compare4(argv[lVar4],argv[lVar4 + 2],uVar2,uVar2);
      a = argv[lVar4 + 1];
      iVar1 = streq(a,"<");
      if ((iVar1 == 0) && (iVar1 = streq(a,"lt"), iVar1 == 0)) {
        iVar1 = streq(a,"<=");
        if (((iVar1 != 0) || (iVar1 = streq(a,"=<"), iVar1 != 0)) ||
           (iVar1 = streq(a,"le"), iVar1 != 0)) {
          return (uint)(0 < (int)uVar2);
        }
        iVar1 = streq(a,"=");
        if ((iVar1 != 0) || (iVar1 = streq(a,"eq"), iVar1 != 0)) {
          return (uint)(uVar2 != 0);
        }
        iVar1 = streq(a,">=");
        if (((iVar1 == 0) && (iVar1 = streq(a,"=>"), iVar1 == 0)) &&
           (iVar1 = streq(a,"ge"), iVar1 == 0)) {
          iVar1 = streq(a,">");
          if ((iVar1 != 0) || (iVar1 = streq(a,"gt"), iVar1 != 0)) {
            return (uint)((int)uVar2 < 1);
          }
          goto LAB_001013c3;
        }
      }
      else {
        uVar2 = ~uVar2;
      }
      return uVar2 >> 0x1f;
    }
    if (argc - _optind == 2) {
      iVar1 = version_compare4(argv[lVar4],argv[lVar4 + 1],uVar2,uVar2);
      if (iVar1 < 0) {
        pcVar5 = "<";
      }
      else if (iVar1 == 0) {
        pcVar5 = "=";
      }
      else {
        pcVar5 = ">";
      }
      puts(pcVar5);
      return 0;
    }
  }
  else {
    if ((iVar1 == 0x3f) || (iVar1 == 0x68)) {
      print_usage(pcVar5);
      return 0;
    }
    if (iVar1 == 0x76) {
      fprintf(_stderr,"libversion %s\n","3.0.3");
      return 0;
    }
  }
LAB_001013c3:
  print_usage(pcVar5);
  return 1;
}

Assistant:

int main(int argc, char** argv) {
	int ch, result, flags = 0;
	const char* progname = argv[0];

	while ((ch = getopt(argc, argv, "pahv")) != -1) {
		switch (ch) {
		case 'p':
			flags |= VERSIONFLAG_P_IS_PATCH;
			break;
		case 'a':
			flags |= VERSIONFLAG_ANY_IS_PATCH;
			break;
		case 'h':
		case '?':
			print_usage(progname);
			return 0;
		case 'v':
			print_version();
			return 0;
		default:
			print_usage(progname);
			return 1;
		}
	}

	argc -= optind;
	argv += optind;

	if (argc == 2) {
		result = version_compare4(argv[0], argv[1], flags, flags);

		if (result < 0)
			printf("<\n");
		else if (result > 0)
			printf(">\n");
		else
			printf("=\n");

		return 0;
	} else if (argc == 3) {
		result = version_compare4(argv[0], argv[2], flags, flags);

		if (streq(argv[1], "<") || streq(argv[1], "lt"))
			return !(result < 0);
		else if (streq(argv[1], "<=") || streq(argv[1], "=<") || streq(argv[1], "le"))
			return !(result <= 0);
		else if (streq(argv[1], "=") || streq(argv[1], "=") || streq(argv[1], "eq"))
			return !(result == 0);
		else if (streq(argv[1], ">=") || streq(argv[1], "=>") || streq(argv[1], "ge"))
			return !(result >= 0);
		else if (streq(argv[1], ">") || streq(argv[1], "gt"))
			return !(result > 0);
	}

	print_usage(progname);
	return 1;
}